

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::reserve_arena(Tree *this,size_t arena_cap)

{
  char *pcVar1;
  substr next_arena;
  
  if ((this->m_arena).len < arena_cap) {
    pcVar1 = (char *)(*(this->m_callbacks).m_allocate)
                               (arena_cap,(this->m_arena).str,(this->m_callbacks).m_user_data);
    if ((this->m_arena).str != (char *)0x0) {
      next_arena.len = arena_cap;
      next_arena.str = pcVar1;
      _relocate(this,next_arena);
      (*(this->m_callbacks).m_free)
                ((this->m_arena).str,(this->m_arena).len,(this->m_callbacks).m_user_data);
    }
    (this->m_arena).str = pcVar1;
    (this->m_arena).len = arena_cap;
  }
  return;
}

Assistant:

void reserve_arena(size_t arena_cap)
    {
        if(arena_cap > m_arena.len)
        {
            substr buf;
            buf.str = (char*) m_callbacks.m_allocate(arena_cap, m_arena.str, m_callbacks.m_user_data);
            buf.len = arena_cap;
            if(m_arena.str)
            {
                RYML_ASSERT(m_arena.len >= 0);
                _relocate(buf); // does a memcpy and changes nodes using the arena
                m_callbacks.m_free(m_arena.str, m_arena.len, m_callbacks.m_user_data);
            }
            m_arena = buf;
        }
    }